

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  u8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  KeyInfo *pKVar8;
  MemPage *pMVar9;
  u8 *puVar10;
  u8 *puVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  uchar *pBuf;
  ulong uVar17;
  uint uVar18;
  u8 *p;
  u32 amt;
  uint uVar19;
  bool bVar20;
  i64 nCellKey;
  code *local_90;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\x01') && ((pCur->curFlags & 2) != 0)) {
      lVar12 = (pCur->info).nKey;
      if (lVar12 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar12 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_00212931;
        if ((lVar12 + 1 == intKey) && (pCur->skipNext == 0)) {
          *pRes = 0;
          iVar13 = sqlite3BtreeNext(pCur,0);
          if (iVar13 != 0x65) {
            if (iVar13 != 0) {
              return iVar13;
            }
            getCellInfo(pCur);
            local_90 = (code *)0x0;
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
            goto LAB_00212533;
          }
        }
      }
    }
    local_90 = (code *)0x0;
  }
  else {
    pKVar8 = pIdxKey->pKeyInfo;
    local_90 = sqlite3VdbeRecordCompare;
    if ((uint)pKVar8->nXField + (uint)pKVar8->nField < 0xe) {
      uVar6 = pIdxKey->aMem->flags;
      bVar20 = *pKVar8->aSortOrder == '\0';
      pIdxKey->r1 = -bVar20 | 1;
      pIdxKey->r2 = -!bVar20 | 1;
      if ((uVar6 & 4) == 0) {
        if (((uVar6 & 0x19) == 0) &&
           (local_90 = sqlite3VdbeRecordCompare, pKVar8->aColl[0] == (CollSeq *)0x0)) {
          local_90 = vdbeRecordCompareString;
        }
      }
      else {
        local_90 = vdbeRecordCompareInt;
      }
    }
    pIdxKey->errCode = '\0';
  }
LAB_00212533:
  iVar13 = moveToRoot(pCur);
  if (iVar13 != 0) {
    return iVar13;
  }
  if (pCur->eState != '\0') {
LAB_00212579:
    pMVar9 = pCur->apPage[pCur->iPage];
    uVar6 = pMVar9->nCell;
    iVar13 = uVar6 - 1;
    uVar14 = iVar13 >> (1U - (char)biasRight & 0x1f);
    pCur->ix = (u16)uVar14;
    if (local_90 == (code *)0x0) {
      puVar10 = pMVar9->aDataOfst;
      uVar7 = pMVar9->maskPage;
      puVar11 = pMVar9->aCellIdx;
      uVar2 = pMVar9->intKeyLeaf;
      uVar19 = 0;
      do {
        p = puVar10 + (CONCAT11(puVar11[(long)(int)uVar14 * 2],puVar11[(long)(int)uVar14 * 2 + 1]) &
                      uVar7);
        if (uVar2 != '\0') {
          while ((char)*p < '\0') {
            p = p + 1;
            if (pMVar9->aDataEnd <= p) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfd37,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
              return 0xb;
            }
          }
          p = p + 1;
        }
        sqlite3GetVarint(p,&local_38);
        if ((long)local_38 < intKey) {
          uVar19 = uVar14 + 1;
          if (iVar13 <= (int)uVar14) goto LAB_00212843;
        }
        else {
          if ((long)local_38 <= intKey) {
            pCur->ix = (u16)uVar14;
            if (pMVar9->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = local_38;
              (pCur->info).nSize = 0;
              *pRes = 0;
              return 0;
            }
            goto LAB_002127cf;
          }
          if ((int)uVar14 <= (int)uVar19) {
            iVar15 = 1;
            goto LAB_002127bc;
          }
          iVar13 = uVar14 - 1;
        }
        uVar14 = (int)(uVar19 + iVar13) >> 1;
      } while( true );
    }
    uVar19 = 0;
    do {
      puVar10 = pMVar9->aDataOfst;
      uVar17 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)(int)uVar14 * 2],
                                pMVar9->aCellIdx[(long)(int)uVar14 * 2 + 1]) & pMVar9->maskPage);
      pbVar16 = puVar10 + uVar17 + 1;
      bVar1 = puVar10[uVar17];
      uVar18 = (uint)bVar1;
      if (pMVar9->max1bytePayload < bVar1) {
        if ((-1 < (char)*pbVar16) &&
           (uVar18 = (bVar1 & 0x7f) << 7 | (int)(char)*pbVar16, uVar18 <= pMVar9->maxLocal)) {
          pbVar16 = puVar10 + uVar17 + 2;
          goto LAB_002126a8;
        }
        (*pMVar9->xParseCell)(pMVar9,puVar10 + (uVar17 - pMVar9->childPtrSize),&pCur->info);
        uVar17 = (pCur->info).nKey;
        amt = (u32)uVar17;
        if ((int)amt < 2) {
          iVar15 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfd81,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          goto LAB_002129a5;
        }
        pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
        if (pBuf == (uchar *)0x0) {
          iVar15 = 7;
          goto LAB_002129a5;
        }
        pCur->ix = (u16)uVar14;
        iVar15 = accessPayload(pCur,0,amt,pBuf,0);
        pCur->curFlags = pCur->curFlags & 0xfb;
        if (iVar15 != 0) {
          sqlite3_free(pBuf);
          goto LAB_002129a5;
        }
        iVar15 = (*local_90)(uVar17 & 0xffffffff,pBuf,pIdxKey);
        sqlite3_free(pBuf);
      }
      else {
LAB_002126a8:
        iVar15 = (*local_90)(uVar18,pbVar16,pIdxKey);
      }
      if (iVar15 < 0) {
        uVar19 = uVar14 + 1;
      }
      else {
        if (iVar15 == 0) {
          *pRes = 0;
          pCur->ix = (u16)uVar14;
          iVar15 = 0xb;
          if (pIdxKey->errCode == '\0') {
            iVar15 = 0;
          }
          goto LAB_002129a5;
        }
        iVar13 = uVar14 - 1;
      }
      if (iVar13 < (int)uVar19) goto LAB_002127bc;
      uVar14 = iVar13 + uVar19 >> 1;
    } while( true );
  }
LAB_00212931:
  *pRes = -1;
  return 0;
LAB_00212843:
  iVar15 = -1;
LAB_002127bc:
  if (pMVar9->leaf != '\0') {
    pCur->ix = (u16)uVar14;
    *pRes = iVar15;
    iVar15 = 0;
    goto LAB_002129a5;
  }
  uVar6 = pMVar9->nCell;
  uVar14 = uVar19;
LAB_002127cf:
  if ((int)uVar14 < (int)(uint)uVar6) {
    lVar12 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)(int)uVar14 * 2],
                              pMVar9->aCellIdx[(long)(int)uVar14 * 2 + 1]) & pMVar9->maskPage) + 3;
  }
  else {
    lVar12 = (ulong)pMVar9->hdrOffset + 0xb;
  }
  pbVar16 = pMVar9->aData + lVar12;
  bVar1 = pbVar16[-3];
  bVar3 = pbVar16[-2];
  bVar4 = pbVar16[-1];
  bVar5 = *pbVar16;
  pCur->ix = (u16)uVar14;
  iVar15 = moveToChild(pCur,(uint)bVar5 |
                            (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar1 << 0x18);
  if (iVar15 != 0) {
LAB_002129a5:
    (pCur->info).nSize = 0;
    return iVar15;
  }
  goto LAB_00212579;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey && !pCur->skipNext ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PGNO(pPage->pgno);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 ){
            rc = SQLITE_CORRUPT_PGNO(pPage->pgno);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = xRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->apPage[pCur->iPage]->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}